

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

bool lsim::deserialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  mapped_type mVar1;
  uint uVar2;
  LSimContext *this;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  xml_node *pxVar9;
  char_t *pcVar10;
  char_t *filename_00;
  ModelCircuit *pMVar11;
  const_iterator cVar12;
  ModelComponent *this_00;
  Property *pPVar13;
  mapped_type *pmVar14;
  ModelWire *this_01;
  long lVar15;
  long lVar16;
  iterator iVar17;
  ulong uVar18;
  size_t idx;
  float fVar19;
  float fVar20;
  xml_node pos_node;
  xml_node initial_output_node;
  xml_node orient_node;
  xml_node comp_node;
  xml_attribute prop_tristate;
  xml_node desc_node;
  Point local_2e0;
  xml_attribute controls_attr;
  xml_node circuit_node;
  xml_node lsim_node;
  xml_node main_node;
  xml_node local_2a0;
  xml_node xStack_298;
  char_t *local_290;
  xml_attribute attr_name;
  xml_node ref_node;
  xml_attribute outputs_attr;
  xml_attribute attr_file;
  xml_named_node_iterator __begin2;
  undefined8 local_1f0;
  xml_attribute type_attr;
  xml_named_node_iterator __begin2_1;
  xml_named_node_iterator __end2;
  xml_named_node_iterator __end2_1;
  Deserializer deserializer;
  
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23e,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (lib == (ModelCircuitLibrary *)0x0) {
    __assert_fail("lib",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23f,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x240,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  pugi::xml_document::xml_document(&deserializer.m_xml);
  deserializer.m_lib = (ModelCircuitLibrary *)0x0;
  deserializer.m_component_id_map._M_h._M_buckets =
       &deserializer.m_component_id_map._M_h._M_single_bucket;
  deserializer.m_component_id_map._M_h._M_bucket_count = 1;
  deserializer.m_component_id_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  deserializer.m_component_id_map._M_h._M_element_count = 0;
  deserializer.m_component_id_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  deserializer.m_component_id_map._M_h._M_rehash_policy._M_next_resize = 0;
  deserializer.m_component_id_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  deserializer.m_context = context;
  pugi::xml_document::load_file
            ((xml_parse_result *)&main_node,&deserializer.m_xml,filename,0x74,encoding_auto);
  bVar3 = pugi::xml_parse_result::operator_cast_to_bool((xml_parse_result *)&main_node);
  if (bVar3) {
    deserializer.m_lib = lib;
    lsim_node = pugi::xml_node::child((xml_node *)&deserializer,"lsim");
    bVar4 = pugi::xml_node::operator!(&lsim_node);
    if (!bVar4) {
      pugi::xml_node::children
                ((xml_object_range<pugi::xml_named_node_iterator> *)&main_node,&lsim_node,
                 "reference");
      __begin2._wrap = main_node;
      __end2._name = local_290;
      __end2._wrap._root = local_2a0._root;
      __end2._parent._root = xStack_298._root;
      while (bVar4 = pugi::xml_named_node_iterator::operator!=(&__begin2,&__end2), bVar4) {
        pxVar9 = pugi::xml_named_node_iterator::operator*(&__begin2);
        ref_node._root = pxVar9->_root;
        attr_name = pugi::xml_node::attribute(&ref_node,"name");
        bVar4 = pugi::xml_attribute::operator!(&attr_name);
        if (bVar4) goto LAB_0010fa2f;
        attr_file = pugi::xml_node::attribute(&ref_node,"file");
        bVar4 = pugi::xml_attribute::operator!(&attr_file);
        this = deserializer.m_context;
        if (bVar4) goto LAB_0010fa2f;
        pcVar10 = pugi::xml_attribute::value(&attr_name);
        filename_00 = pugi::xml_attribute::value(&attr_file);
        LSimContext::load_reference_library(this,pcVar10,filename_00);
        pcVar10 = pugi::xml_attribute::value(&attr_name);
        ModelCircuitLibrary::add_reference(lib,pcVar10);
        pugi::xml_named_node_iterator::operator++(&__begin2);
      }
      pugi::xml_node::children
                ((xml_object_range<pugi::xml_named_node_iterator> *)&__end2,&lsim_node,"circuit");
      __begin2_1._name = __end2._name;
      __begin2_1._wrap = __end2._wrap;
      __begin2_1._parent = __end2._parent;
      while( true ) {
        bVar4 = pugi::xml_named_node_iterator::operator!=(&__begin2_1,&__end2_1);
        if (!bVar4) break;
        pxVar9 = pugi::xml_named_node_iterator::operator*(&__begin2_1);
        circuit_node._root = pxVar9->_root;
        main_node._root = (xml_node_struct *)pugi::xml_node::attribute(&circuit_node,"name");
        pcVar10 = pugi::xml_attribute::as_string((xml_attribute *)&main_node,"");
        if ((pcVar10 != (char_t *)0x0) &&
           (pMVar11 = ModelCircuitLibrary::create_circuit
                                (deserializer.m_lib,pcVar10,deserializer.m_context),
           pMVar11 != (ModelCircuit *)0x0)) {
          pugi::xml_node::children
                    ((xml_object_range<pugi::xml_named_node_iterator> *)&main_node,&circuit_node,
                     "component");
          ref_node = main_node;
          attr_name._attr = (xml_attribute_struct *)local_2a0._root;
          while (bVar4 = pugi::xml_named_node_iterator::operator!=
                                   ((xml_named_node_iterator *)&ref_node,
                                    (xml_named_node_iterator *)&attr_name), bVar4) {
            pxVar9 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&ref_node);
            comp_node._root = pxVar9->_root;
            attr_file = pugi::xml_node::attribute(&comp_node,"id");
            bVar4 = pugi::xml_attribute::operator!(&attr_file);
            if (bVar4) goto switchD_0010fe67_caseD_5;
            type_attr = pugi::xml_node::attribute(&comp_node,"type");
            bVar4 = pugi::xml_attribute::operator!(&type_attr);
            if (bVar4) goto switchD_0010fe67_caseD_5;
            pcVar10 = pugi::xml_attribute::as_string(&type_attr,"");
            std::__cxx11::string::string((string *)&__begin2,pcVar10,(allocator *)&outputs_attr);
            cVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(anonymous_namespace)::name_to_component_type_abi_cxx11_,
                            (key_type *)&__begin2);
            std::__cxx11::string::~string((string *)&__begin2);
            if (cVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                ._M_cur == (__node_type *)0x0) goto switchD_0010fe67_caseD_5;
            iVar8 = *(int *)((long)cVar12.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                   ._M_cur + 0x28);
            __begin2._wrap._root = (xml_node_struct *)pugi::xml_node::attribute(&comp_node,"inputs")
            ;
            bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&__begin2);
            if (bVar4) goto switchD_0010fe67_caseD_5;
            outputs_attr = pugi::xml_node::attribute(&comp_node,"outputs");
            bVar4 = pugi::xml_attribute::operator!(&outputs_attr);
            if (bVar4) goto switchD_0010fe67_caseD_5;
            controls_attr = pugi::xml_node::attribute(&comp_node,"controls");
            bVar4 = pugi::xml_attribute::operator!(&controls_attr);
            if (bVar4) goto switchD_0010fe67_caseD_5;
            uVar5 = pugi::xml_attribute::as_int((xml_attribute *)&__begin2,0);
            uVar6 = pugi::xml_attribute::as_int(&outputs_attr,0);
            iVar7 = pugi::xml_attribute::as_int(&controls_attr,0);
            switch(iVar8) {
            case 1:
              if (uVar5 != 0) {
                __assert_fail("num_inputs == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x119,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 == 0) {
                __assert_fail("num_outputs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x11a,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x11b,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              initial_output_node =
                   pugi::xml_node::find_child_by_attribute(&comp_node,"property","key","name");
              bVar4 = pugi::xml_node::operator!(&initial_output_node);
              if (!bVar4) {
                pos_node._root =
                     (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
                bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
                if (!bVar4) {
                  orient_node = pugi::xml_node::find_child_by_attribute
                                          (&comp_node,"property","key","tri_state");
                  bVar4 = pugi::xml_node::operator!(&orient_node);
                  if (!bVar4) {
                    prop_tristate = pugi::xml_node::attribute(&orient_node,"value");
                    bVar4 = pugi::xml_attribute::operator!(&prop_tristate);
                    if (!bVar4) {
                      pcVar10 = pugi::xml_attribute::as_string((xml_attribute *)&pos_node,"");
                      bVar4 = pugi::xml_attribute::as_bool(&prop_tristate,false);
                      this_00 = ModelCircuit::add_connector_in(pMVar11,pcVar10,uVar6,bVar4);
                      desc_node = pugi::xml_node::find_child_by_attribute
                                            (&comp_node,"property","key","descending");
                      bVar4 = pugi::xml_node::operator!(&desc_node);
                      if (!bVar4) {
                        pPVar13 = ModelComponent::property(this_00,"descending");
                        local_2e0 = (Point)pugi::xml_node::attribute(&desc_node,"value");
                        bVar4 = pugi::xml_attribute::as_bool((xml_attribute *)&local_2e0,false);
                        (*pPVar13->_vptr_Property[10])(pPVar13,(ulong)bVar4);
                      }
                      break;
                    }
                  }
                }
              }
              goto switchD_0010fe67_caseD_5;
            case 2:
              if (uVar5 == 0) {
                __assert_fail("num_inputs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x127,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 0) {
                __assert_fail("num_outputs == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x128,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x129,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              initial_output_node =
                   pugi::xml_node::find_child_by_attribute(&comp_node,"property","key","name");
              bVar4 = pugi::xml_node::operator!(&initial_output_node);
              if (!bVar4) {
                pos_node._root =
                     (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
                bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
                if (!bVar4) {
                  orient_node = pugi::xml_node::find_child_by_attribute
                                          (&comp_node,"property","key","tri_state");
                  bVar4 = pugi::xml_node::operator!(&orient_node);
                  if (!bVar4) {
                    prop_tristate = pugi::xml_node::attribute(&orient_node,"value");
                    bVar4 = pugi::xml_attribute::operator!(&prop_tristate);
                    if (!bVar4) {
                      pcVar10 = pugi::xml_attribute::as_string((xml_attribute *)&pos_node,"");
                      bVar4 = pugi::xml_attribute::as_bool(&prop_tristate,false);
                      this_00 = ModelCircuit::add_connector_out(pMVar11,pcVar10,uVar5,bVar4);
                      desc_node = pugi::xml_node::find_child_by_attribute
                                            (&comp_node,"property","key","descending");
                      bVar4 = pugi::xml_node::operator!(&desc_node);
                      if (!bVar4) {
                        pPVar13 = ModelComponent::property(this_00,"descending");
                        local_2e0 = (Point)pugi::xml_node::attribute(&desc_node,"value");
                        bVar4 = pugi::xml_attribute::as_bool((xml_attribute *)&local_2e0,false);
                        (*pPVar13->_vptr_Property[10])(pPVar13,(ulong)bVar4);
                      }
                      break;
                    }
                  }
                }
              }
              goto switchD_0010fe67_caseD_5;
            case 3:
              if (uVar5 != 0) {
                __assert_fail("num_inputs == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x135,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x136,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x137,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              initial_output_node =
                   pugi::xml_node::find_child_by_attribute(&comp_node,"property","key","value");
              bVar4 = pugi::xml_node::operator!(&initial_output_node);
              if (!bVar4) {
                pos_node._root =
                     (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
                bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
                if (!bVar4) {
                  this_00 = ModelCircuit::add_constant(pMVar11,VALUE_FALSE);
                  pPVar13 = ModelComponent::property(this_00,"value");
                  pcVar10 = pugi::xml_attribute::value((xml_attribute *)&pos_node);
                  (*pPVar13->_vptr_Property[8])(pPVar13,pcVar10);
                  break;
                }
              }
              goto switchD_0010fe67_caseD_5;
            case 4:
              if (uVar5 != 0) {
                __assert_fail("num_inputs == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x13e,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x13f,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x140,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              initial_output_node =
                   pugi::xml_node::find_child_by_attribute(&comp_node,"property","key","pull_to");
              bVar4 = pugi::xml_node::operator!(&initial_output_node);
              if (!bVar4) {
                pos_node._root =
                     (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
                bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
                if (!bVar4) {
                  this_00 = ModelCircuit::add_pull_resistor(pMVar11,VALUE_FALSE);
                  pPVar13 = ModelComponent::property(this_00,"pull_to");
                  pcVar10 = pugi::xml_attribute::value((xml_attribute *)&pos_node);
                  (*pPVar13->_vptr_Property[8])(pPVar13,pcVar10);
                  break;
                }
              }
            case 5:
            case 6:
            case 7:
            case 8:
            case 9:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
            case 0x10:
            case 0x1a:
            case 0x1b:
            case 0x1c:
            case 0x1d:
            case 0x1e:
            case 0x1f:
              goto switchD_0010fe67_caseD_5;
            case 0x11:
              if (uVar5 != uVar6) {
                __assert_fail("num_inputs == num_outputs",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x147,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x148,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_buffer(pMVar11,uVar5);
              break;
            case 0x12:
              if (uVar5 != uVar6) {
                __assert_fail("num_inputs == num_outputs",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x14c,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 1) {
                __assert_fail("num_controls == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x14d,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_tristate_buffer(pMVar11,uVar5);
              break;
            case 0x13:
              if (uVar5 == 0) {
                __assert_fail("num_inputs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x151,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x152,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x153,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_and_gate(pMVar11,uVar5);
              break;
            case 0x14:
              if (uVar5 == 0) {
                __assert_fail("num_inputs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x157,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x158,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x159,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_or_gate(pMVar11,uVar5);
              break;
            case 0x15:
              if (uVar5 != 1) {
                __assert_fail("num_inputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x15d,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x15e,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x15f,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_not_gate(pMVar11);
              break;
            case 0x16:
              if (uVar5 == 0) {
                __assert_fail("num_inputs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x163,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x164,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x165,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_nand_gate(pMVar11,uVar5);
              break;
            case 0x17:
              if (uVar5 == 0) {
                __assert_fail("num_inputs > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x169,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x16a,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x16b,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_nor_gate(pMVar11,uVar5);
              break;
            case 0x18:
              if (uVar5 != 2) {
                __assert_fail("num_inputs == 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x16f,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x170,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x171,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_xor_gate(pMVar11);
              break;
            case 0x19:
              if (uVar5 != 2) {
                __assert_fail("num_inputs == 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x175,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x176,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x177,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              this_00 = ModelCircuit::add_xnor_gate(pMVar11);
              break;
            case 0x20:
              if (uVar5 == 0) {
                __assert_fail("num_inputs >= 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x17b,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 0) {
                __assert_fail("num_outputs == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x17c,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x17d,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              initial_output_node =
                   pugi::xml_node::find_child_by_attribute(&comp_node,"property","key","name");
              bVar4 = pugi::xml_node::operator!(&initial_output_node);
              if (!bVar4) {
                pos_node._root =
                     (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
                bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
                if (!bVar4) {
                  orient_node = pugi::xml_node::find_child_by_attribute
                                          (&comp_node,"property","key","right");
                  bVar4 = pugi::xml_node::operator!(&orient_node);
                  if (!bVar4) {
                    prop_tristate = pugi::xml_node::attribute(&orient_node,"value");
                    bVar4 = pugi::xml_attribute::operator!(&prop_tristate);
                    if (!bVar4) {
                      pcVar10 = pugi::xml_attribute::as_string((xml_attribute *)&pos_node,"");
                      this_00 = ModelCircuit::add_via(pMVar11,pcVar10,uVar5);
                      pPVar13 = ModelComponent::property(this_00,"right");
                      bVar4 = pugi::xml_attribute::as_bool(&prop_tristate,false);
                      (*pPVar13->_vptr_Property[10])(pPVar13,(ulong)bVar4);
                      break;
                    }
                  }
                }
              }
              goto switchD_0010fe67_caseD_5;
            case 0x21:
              if (uVar5 != 0) {
                __assert_fail("num_inputs == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x185,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (uVar6 != 1) {
                __assert_fail("num_outputs == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x186,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              if (iVar7 != 0) {
                __assert_fail("num_controls == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                              ,0x187,
                              "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                             );
              }
              initial_output_node =
                   pugi::xml_node::find_child_by_attribute
                             (&comp_node,"property","key","low_duration");
              bVar4 = pugi::xml_node::operator!(&initial_output_node);
              if (!bVar4) {
                pos_node._root =
                     (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
                bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
                if (!bVar4) {
                  orient_node = pugi::xml_node::find_child_by_attribute
                                          (&comp_node,"property","key","high_duration");
                  bVar4 = pugi::xml_node::operator!(&orient_node);
                  if (!bVar4) {
                    prop_tristate = pugi::xml_node::attribute(&orient_node,"value");
                    bVar4 = pugi::xml_attribute::operator!(&prop_tristate);
                    if (!bVar4) {
                      uVar5 = pugi::xml_attribute::as_int((xml_attribute *)&pos_node,0);
                      uVar6 = pugi::xml_attribute::as_int(&prop_tristate,0);
                      this_00 = ModelCircuit::add_oscillator(pMVar11,uVar5,uVar6);
                      break;
                    }
                  }
                }
              }
              goto switchD_0010fe67_caseD_5;
            default:
              if (iVar8 == 0x101) {
                if (uVar5 != 8) {
                  __assert_fail("num_inputs == 8",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x18e,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar6 != 0) {
                  __assert_fail("num_outputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,399,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar7 != 1) {
                  __assert_fail("num_controls == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,400,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_7_segment_led(pMVar11);
                break;
              }
              if (iVar8 == 0x301) {
                initial_output_node._root =
                     (xml_node_struct *)pugi::xml_node::attribute(&comp_node,"nested");
                bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&initial_output_node);
                if (!bVar4) {
                  pcVar10 = pugi::xml_attribute::as_string((xml_attribute *)&initial_output_node,"")
                  ;
                  this_00 = ModelCircuit::add_sub_circuit(pMVar11,pcVar10,uVar5,uVar6);
                  pos_node = pugi::xml_node::find_child_by_attribute
                                       (&comp_node,"property","key","flip");
                  bVar4 = pugi::xml_node::operator!(&pos_node);
                  if (!bVar4) {
                    pPVar13 = ModelComponent::property(this_00,"flip");
                    orient_node._root =
                         (xml_node_struct *)pugi::xml_node::attribute(&pos_node,"value");
                    bVar4 = pugi::xml_attribute::as_bool((xml_attribute *)&orient_node,false);
                    (*pPVar13->_vptr_Property[10])(pPVar13,(ulong)bVar4);
                  }
                  orient_node = pugi::xml_node::find_child_by_attribute
                                          (&comp_node,"property","key","caption");
                  bVar4 = pugi::xml_node::operator!(&orient_node);
                  if (!bVar4) {
                    pPVar13 = ModelComponent::property(this_00,"caption");
                    prop_tristate = pugi::xml_node::attribute(&orient_node,"value");
                    pcVar10 = pugi::xml_attribute::as_string(&prop_tristate,"");
                    (*pPVar13->_vptr_Property[8])(pPVar13,pcVar10);
                  }
                  break;
                }
              }
              else if (iVar8 == 0x401) {
                initial_output_node =
                     pugi::xml_node::find_child_by_attribute(&comp_node,"property","key","text");
                bVar4 = pugi::xml_node::operator!(&initial_output_node);
                if (!bVar4) {
                  pos_node._root =
                       (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
                  bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
                  if (!bVar4) {
                    pcVar10 = pugi::xml_attribute::value((xml_attribute *)&pos_node);
                    this_00 = ModelCircuit::add_text(pMVar11,pcVar10);
                    break;
                  }
                }
              }
              goto switchD_0010fe67_caseD_5;
            }
            initial_output_node =
                 pugi::xml_node::find_child_by_attribute
                           (&comp_node,"property","key","initial_output");
            bVar4 = pugi::xml_node::operator!(&initial_output_node);
            if (!bVar4) {
              pPVar13 = ModelComponent::property(this_00,"initial_output");
              pos_node._root =
                   (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
              pcVar10 = pugi::xml_attribute::value((xml_attribute *)&pos_node);
              (*pPVar13->_vptr_Property[8])(pPVar13,pcVar10);
            }
            pos_node = pugi::xml_node::child(&comp_node,"position");
            bVar4 = pugi::xml_node::operator!(&pos_node);
            if (bVar4) {
LAB_00110938:
              orient_node = pugi::xml_node::child(&comp_node,"orientation");
              bVar4 = pugi::xml_node::operator!(&orient_node);
              if (!bVar4) {
                prop_tristate = pugi::xml_node::attribute(&orient_node,"angle");
                bVar4 = pugi::xml_attribute::operator!(&prop_tristate);
                if (bVar4) goto switchD_0010fe67_caseD_5;
                iVar8 = pugi::xml_attribute::as_int(&prop_tristate,0);
                ModelComponent::set_angle(this_00,iVar8);
              }
              if (this_00 != (ModelComponent *)0x0) {
                mVar1 = this_00->m_id;
                iVar8 = pugi::xml_attribute::as_int(&attr_file,0);
                prop_tristate._attr._0_4_ = iVar8;
                pmVar14 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&deserializer.m_component_id_map,
                                       (key_type *)&prop_tristate);
                *pmVar14 = mVar1;
              }
            }
            else {
              orient_node._root = (xml_node_struct *)pugi::xml_node::attribute(&pos_node,"x");
              bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&orient_node);
              if (!bVar4) {
                prop_tristate = pugi::xml_node::attribute(&pos_node,"y");
                bVar4 = pugi::xml_attribute::operator!(&prop_tristate);
                if (!bVar4) {
                  fVar19 = pugi::xml_attribute::as_float((xml_attribute *)&orient_node,0.0);
                  fVar20 = pugi::xml_attribute::as_float(&prop_tristate,0.0);
                  Point::Point((Point *)&desc_node,fVar19,fVar20);
                  ModelComponent::set_position(this_00,(Point *)&desc_node);
                  goto LAB_00110938;
                }
              }
            }
switchD_0010fe67_caseD_5:
            pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&ref_node);
          }
          pugi::xml_node::children
                    ((xml_object_range<pugi::xml_named_node_iterator> *)&__begin2,&circuit_node,
                     "wire");
          type_attr._attr = (xml_attribute_struct *)__begin2._wrap._root;
          outputs_attr._attr = (xml_attribute_struct *)local_1f0;
          while( true ) {
            bVar4 = pugi::xml_named_node_iterator::operator!=
                              ((xml_named_node_iterator *)&type_attr,
                               (xml_named_node_iterator *)&outputs_attr);
            if (!bVar4) break;
            pxVar9 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)&type_attr)
            ;
            controls_attr._attr = (xml_attribute_struct *)pxVar9->_root;
            this_01 = ModelCircuit::create_wire(pMVar11);
            pugi::xml_node::children
                      ((xml_object_range<pugi::xml_named_node_iterator> *)&main_node,
                       (xml_node *)&controls_attr,"segment");
            ref_node = main_node;
            attr_name._attr = (xml_attribute_struct *)local_2a0._root;
            while (bVar4 = pugi::xml_named_node_iterator::operator!=
                                     ((xml_named_node_iterator *)&ref_node,
                                      (xml_named_node_iterator *)&attr_name), bVar4) {
              pxVar9 = pugi::xml_named_node_iterator::operator*
                                 ((xml_named_node_iterator *)&ref_node);
              attr_file._attr = (xml_attribute_struct *)pxVar9->_root;
              initial_output_node._root =
                   (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&attr_file,"x1");
              bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&initial_output_node);
              if (bVar4) goto LAB_00110e3d;
              pos_node._root =
                   (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&attr_file,"y1");
              bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
              if (bVar4) goto LAB_00110e3d;
              orient_node._root =
                   (xml_node_struct *)pugi::xml_node::attribute((xml_node *)&attr_file,"x2");
              bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&orient_node);
              if (bVar4) goto LAB_00110e3d;
              prop_tristate = pugi::xml_node::attribute((xml_node *)&attr_file,"y2");
              bVar4 = pugi::xml_attribute::operator!(&prop_tristate);
              if (bVar4) goto LAB_00110e3d;
              fVar19 = pugi::xml_attribute::as_float((xml_attribute *)&initial_output_node,0.0);
              fVar20 = pugi::xml_attribute::as_float((xml_attribute *)&pos_node,0.0);
              Point::Point((Point *)&desc_node,fVar19,fVar20);
              fVar19 = pugi::xml_attribute::as_float((xml_attribute *)&orient_node,0.0);
              fVar20 = pugi::xml_attribute::as_float(&prop_tristate,0.0);
              Point::Point(&local_2e0,fVar19,fVar20);
              ModelWire::add_segment(this_01,(Point *)&desc_node,&local_2e0);
              pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&ref_node);
            }
            pugi::xml_node::children
                      ((xml_object_range<pugi::xml_named_node_iterator> *)&main_node,
                       (xml_node *)&controls_attr,"pin");
            attr_name._attr = (xml_attribute_struct *)main_node._root;
            attr_file._attr = (xml_attribute_struct *)local_2a0._root;
            while( true ) {
              bVar4 = pugi::xml_named_node_iterator::operator!=
                                ((xml_named_node_iterator *)&attr_name,
                                 (xml_named_node_iterator *)&attr_file);
              if (!bVar4) break;
              pxVar9 = pugi::xml_named_node_iterator::operator*
                                 ((xml_named_node_iterator *)&attr_name);
              initial_output_node._root = pxVar9->_root;
              pos_node._root =
                   (xml_node_struct *)pugi::xml_node::attribute(&initial_output_node,"value");
              bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&pos_node);
              if (bVar4) break;
              pcVar10 = pugi::xml_attribute::as_string((xml_attribute *)&pos_node,"");
              std::__cxx11::string::string((string *)&ref_node,pcVar10,(allocator *)&orient_node);
              lVar15 = std::__cxx11::string::find((char)(xml_named_node_iterator *)&ref_node,0x23);
              if (lVar15 == -1) {
                error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                          ,"Unparseable location \"%s\"; should contain a comma");
              }
              else {
                lVar16 = strtol((char *)ref_node._root,(char **)0x0,0);
                orient_node._root._0_4_ = (int)lVar16;
                iVar17 = std::
                         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(&deserializer.m_component_id_map._M_h,(key_type *)&orient_node);
                if (iVar17.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur == (__node_type *)0x0) {
                  error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                            ,"Unknown component-id \"%d\" in wire",lVar16);
                }
                uVar2 = *(uint *)((long)iVar17.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                        ._M_cur + 0xc);
                uVar18 = strtol((char *)((long)&(ref_node._root)->header + lVar15 + 1),(char **)0x0,
                                0);
                ModelWire::add_pin(this_01,uVar18 & 0xffffffff | (ulong)uVar2 << 0x20);
              }
              std::__cxx11::string::~string((string *)&ref_node);
              if (lVar15 == -1) break;
              pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&attr_name);
            }
LAB_00110e3d:
            pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)&type_attr);
          }
        }
        pugi::xml_named_node_iterator::operator++(&__begin2_1);
      }
      main_node = pugi::xml_node::child(&lsim_node,"main");
      bVar4 = pugi::xml_node::operator!(&main_node);
      if (!bVar4) {
        __begin2._wrap._root = (xml_node_struct *)pugi::xml_node::attribute(&main_node,"name");
        bVar4 = pugi::xml_attribute::operator!((xml_attribute *)&__begin2);
        if (bVar4) goto LAB_0010fa2f;
        pugi::xml_attribute::as_string((xml_attribute *)&__begin2,"");
        std::__cxx11::string::assign((char *)&lib->m_main_circuit);
      }
      for (uVar18 = 0;
          uVar18 < (ulong)((long)(lib->m_circuits).
                                 super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(lib->m_circuits).
                                 super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar18 = uVar18 + 1) {
        pMVar11 = ModelCircuitLibrary::circuit_by_idx(lib,uVar18);
        ModelCircuit::sync_sub_circuit_components(pMVar11);
      }
    }
  }
LAB_0010fa2f:
  anon_unknown.dwarf_9671a::Deserializer::~Deserializer(&deserializer);
  return bVar3;
}

Assistant:

bool deserialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Deserializer deserializer(context);
    
    if (!deserializer.load_from_file(filename)) {
        return false;
    }

    deserializer.parse_library(lib);

    return true;
}